

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Unpin(sqlite3_pcache *p,sqlite3_pcache_page *pPg,int reuseUnlikely)

{
  long lVar1;
  void *pvVar2;
  PgHdr1 **ppFirst;
  PGroup *pGroup;
  PgHdr1 *pPage;
  PCache1 *pCache;
  int reuseUnlikely_local;
  sqlite3_pcache_page *pPg_local;
  sqlite3_pcache *p_local;
  
  lVar1 = *(long *)p;
  if ((reuseUnlikely == 0) && (*(uint *)(lVar1 + 0x14) <= *(uint *)(lVar1 + 8))) {
    pPg[3].pBuf = (void *)(lVar1 + 0x18);
    pvVar2 = *(void **)(lVar1 + 0x40);
    pPg[2].pExtra = pvVar2;
    *(sqlite3_pcache_page **)((long)pvVar2 + 0x30) = pPg;
    *(sqlite3_pcache_page **)(lVar1 + 0x40) = pPg;
    *(int *)(p + 0x28) = *(int *)(p + 0x28) + 1;
    *(undefined1 *)((long)&pPg[1].pBuf + 4) = 0;
  }
  else {
    pcache1RemoveFromHash((PgHdr1 *)pPg,1);
  }
  return;
}

Assistant:

static void pcache1Unpin(
  sqlite3_pcache *p, 
  sqlite3_pcache_page *pPg, 
  int reuseUnlikely
){
  PCache1 *pCache = (PCache1 *)p;
  PgHdr1 *pPage = (PgHdr1 *)pPg;
  PGroup *pGroup = pCache->pGroup;
 
  assert( pPage->pCache==pCache );
  pcache1EnterMutex(pGroup);

  /* It is an error to call this function if the page is already 
  ** part of the PGroup LRU list.
  */
  assert( pPage->pLruPrev==0 && pPage->pLruNext==0 );
  assert( pPage->isPinned==1 );

  if( reuseUnlikely || pGroup->nCurrentPage>pGroup->nMaxPage ){
    pcache1RemoveFromHash(pPage, 1);
  }else{
    /* Add the page to the PGroup LRU list. */
    PgHdr1 **ppFirst = &pGroup->lru.pLruNext;
    pPage->pLruPrev = &pGroup->lru;
    (pPage->pLruNext = *ppFirst)->pLruPrev = pPage;
    *ppFirst = pPage;
    pCache->nRecyclable++;
    pPage->isPinned = 0;
  }

  pcache1LeaveMutex(pCache->pGroup);
}